

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O1

void Gia_ObjRemoveFanout(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanout)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  if (p->pFanData == (int *)0x0) {
LAB_006d71f0:
    __assert_fail("p->pFanData && Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0xa6,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
LAB_006d71d1:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar6 = (int)((ulong)((long)pObj - (long)pGVar2) >> 2);
  iVar8 = iVar6 * -0x55555555;
  iVar7 = p->nFansAlloc;
  if (iVar7 == iVar8 || SBORROW4(iVar7,iVar8) != iVar7 + iVar6 * 0x55555555 < 0) goto LAB_006d71f0;
  if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_006d71d1;
  iVar6 = (int)((ulong)((long)pFanout - (long)pGVar2) >> 2);
  iVar8 = iVar6 * -0x55555555;
  if (iVar7 == iVar8 || SBORROW4(iVar7,iVar8) != iVar7 + iVar6 * 0x55555555 < 0) goto LAB_006d71f0;
  if ((((uint)pFanout | (uint)pObj) & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0xa7,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if (iVar8 < 1) {
    __assert_fail("Gia_ObjId(p, pFanout) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0xa8,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  uVar4 = Gia_ObjWhatFanin(p,pFanout,pObj);
  if (1 < uVar4) {
    __assert_fail("Num < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0x24,"int Gia_FanoutCreate(int, int)");
  }
  uVar1 = uVar4 + iVar6 * 0x55555556;
  piVar3 = p->pFanData;
  iVar7 = iVar6 * 0x55555556 >> 1;
  uVar5 = (ulong)uVar4;
  uVar4 = piVar3[(long)(iVar7 * 5) + uVar5 + 3];
  lVar12 = (long)(((int)uVar4 >> 1) * 5);
  uVar9 = uVar4 & 1;
  if (piVar3[lVar12 + (ulong)uVar9 + 1] != uVar1) {
    __assert_fail("*pPrev == iFan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0xae,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  lVar11 = (long)((piVar3[(long)(iVar7 * 5) + uVar5 + 1] >> 1) * 5);
  uVar10 = (ulong)(piVar3[(long)(iVar7 * 5) + uVar5 + 1] & 1);
  if (piVar3[lVar11 + uVar10 + 3] != uVar1) {
    __assert_fail("*pNext == iFan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0xaf,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_006d71d1;
  lVar13 = (long)(((ulong)((long)pObj - (long)pGVar2) >> 2) * 0x5555555700000000) >> 0x1e;
  if ((int)*(uint *)((long)piVar3 + lVar13) < 1) {
    __assert_fail("*pFirst > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0xb1,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if (*(uint *)((long)piVar3 + lVar13) == uVar1) {
    if (uVar4 == uVar1) {
      iVar6 = 0;
      *(undefined4 *)((long)piVar3 + lVar13) = 0;
      piVar3[lVar12 + (ulong)uVar9 + 1] = 0;
      goto LAB_006d71bd;
    }
    *(uint *)((long)piVar3 + lVar13) = uVar4;
  }
  piVar3[lVar12 + (ulong)uVar9 + 1] = piVar3[(long)(iVar7 * 5) + uVar5 + 1];
  iVar6 = piVar3[(long)(iVar7 * 5) + uVar5 + 3];
LAB_006d71bd:
  piVar3[lVar11 + uVar10 + 3] = iVar6;
  piVar3[(long)(iVar7 * 5) + uVar5 + 1] = 0;
  piVar3[(long)(iVar7 * 5) + uVar5 + 3] = 0;
  return;
}

Assistant:

void Gia_ObjRemoveFanout( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData && Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc );
    assert( !Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout) );
    assert( Gia_ObjId(p, pFanout) > 0 );
    iFan   = Gia_FanoutCreate( Gia_ObjId(p, pFanout), Gia_ObjWhatFanin(p, pFanout, pObj) );
    pPrevC = Gia_FanoutPrev( p->pFanData, iFan );
    pNextC = Gia_FanoutNext( p->pFanData, iFan );
    pPrev  = Gia_FanoutPrev( p->pFanData, *pNextC );
    pNext  = Gia_FanoutNext( p->pFanData, *pPrevC );
    assert( *pPrev == iFan );
    assert( *pNext == iFan );
    pFirst = Gia_FanoutObj( p->pFanData, Gia_ObjId(p, pObj) );
    assert( *pFirst > 0 );
    if ( *pFirst == iFan )
    {
        if ( *pNextC == iFan )
        {
            *pFirst = 0;
            *pPrev  = 0;
            *pNext  = 0;
            *pPrevC = 0;
            *pNextC = 0;
            return;
        }
        *pFirst = *pNextC;
    }
    *pPrev  = *pPrevC;
    *pNext  = *pNextC;
    *pPrevC = 0;
    *pNextC = 0;
}